

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http2.c
# Opt level: O2

int lws_h2_settings(lws *wsi,http2_settings *settings,uchar *buf,int len)

{
  byte bVar1;
  uint uVar2;
  lws *wsi_00;
  ushort uVar3;
  int iVar4;
  lws *wsi_01;
  lws **pplVar5;
  char *reason;
  uint uVar6;
  uint32_t uVar7;
  lws **pplVar8;
  uint uVar9;
  
  wsi_01 = lws_get_network_wsi(wsi);
  if (len == 0) {
    uVar6 = 0;
  }
  else {
    uVar6 = 1;
    if (5 < len) {
      pplVar5 = &(wsi_01->mux).child_list;
      for (; 5 < len; len = len + -6) {
        uVar3 = *(ushort *)buf << 8 | *(ushort *)buf >> 8;
        if (0xfffffff7 < uVar3 - 9) {
          bVar1 = (byte)*(ushort *)((long)buf + 2);
          uVar9 = (uint)*(byte *)((long)buf + 5) | (uint)*(byte *)((long)buf + 3) << 0x10 |
                  (uint)(byte)*(ushort *)((long)buf + 4) << 8 | (uint)bVar1 << 0x18;
          uVar6 = (uint)uVar3;
          uVar7 = uVar9;
          if (uVar3 == 5) {
            if (uVar9 < (wsi->vhost->h2).set.s[5]) {
              reason = "Frame size < initial";
            }
            else {
              if (bVar1 == 0) goto LAB_0012a47c;
              reason = "Settings Frame size above max";
            }
LAB_0012a4da:
            uVar7 = 1;
LAB_0012a4e5:
            lws_h2_goaway(wsi_01,uVar7,reason);
            return 1;
          }
          if (uVar3 == 4) {
            if ((int)((uint)bVar1 << 0x18) < 0) {
              reason = "Inital Window beyond max";
              uVar7 = 3;
              goto LAB_0012a4e5;
            }
            pplVar8 = pplVar5;
            if (((wsi->flags & 0x40) == 0) || (uVar7 = 0x7ffffff, uVar9 != 0x7fffffff)) {
              while (wsi_00 = *pplVar8, uVar7 = uVar9, wsi_00 != (lws *)0x0) {
                uVar2 = (wsi_00->txc).tx_cr;
                _lws_log(8,"%s: adi child tc cr %d +%d -> %d","lws_h2_settings",(ulong)uVar2,
                         (ulong)(uVar9 - settings->s[4]),(ulong)((uVar2 + uVar9) - settings->s[4]));
                iVar4 = (uVar9 - settings->s[4]) + (wsi_00->txc).tx_cr;
                (wsi_00->txc).tx_cr = iVar4;
                if ((0 < iVar4) && (iVar4 <= (int)(uVar9 - settings->s[4]))) {
                  lws_callback_on_writable(wsi_00);
                }
                pplVar8 = &(wsi_00->mux).sibling_list;
              }
            }
          }
          else if ((uVar6 == 2) && (1 < uVar9)) {
            reason = "ENABLE_PUSH invalid arg";
            goto LAB_0012a4da;
          }
LAB_0012a47c:
          settings->s[uVar6] = uVar7;
          _lws_log(8,"http2 settings %d <- 0x%x\n",(ulong)uVar6);
        }
        buf = (uchar *)((long)buf + 6);
      }
      uVar6 = (uint)(len != 0);
    }
  }
  return uVar6;
}

Assistant:

int
lws_h2_settings(struct lws *wsi, struct http2_settings *settings,
		unsigned char *buf, int len)
{
	struct lws *nwsi = lws_get_network_wsi(wsi);
	unsigned int a, b;

	if (!len)
		return 0;

	if (len < LWS_H2_SETTINGS_LEN)
		return 1;

	while (len >= LWS_H2_SETTINGS_LEN) {
		a = (buf[0] << 8) | buf[1];
		if (!a || a >= H2SET_COUNT)
			goto skip;
		b = buf[2] << 24 | buf[3] << 16 | buf[4] << 8 | buf[5];

		switch (a) {
		case H2SET_HEADER_TABLE_SIZE:
			break;
		case H2SET_ENABLE_PUSH:
			if (b > 1) {
				lws_h2_goaway(nwsi, H2_ERR_PROTOCOL_ERROR,
					      "ENABLE_PUSH invalid arg");
				return 1;
			}
			break;
		case H2SET_MAX_CONCURRENT_STREAMS:
			break;
		case H2SET_INITIAL_WINDOW_SIZE:
			if (b > 0x7fffffff) {
				lws_h2_goaway(nwsi, H2_ERR_FLOW_CONTROL_ERROR,
					      "Inital Window beyond max");
				return 1;
			}

#if defined(LWS_WITH_CLIENT)
#if defined(LWS_AMAZON_RTOS) || defined(LWS_AMAZON_LINUX)
			if (
#else
			if (wsi->flags & LCCSCF_H2_QUIRK_OVERFLOWS_TXCR &&
#endif
			    b == 0x7fffffff) {
				b >>= 4;

				break;
			}
#endif

			/*
			 * In addition to changing the flow-control window for
			 * streams that are not yet active, a SETTINGS frame
			 * can alter the initial flow-control window size for
			 * streams with active flow-control windows (that is,
			 * streams in the "open" or "half-closed (remote)"
			 * state).  When the value of
			 * SETTINGS_INITIAL_WINDOW_SIZE changes, a receiver
			 * MUST adjust the size of all stream flow-control
			 * windows that it maintains by the difference between
			 * the new value and the old value.
			 */

			lws_start_foreach_ll(struct lws *, w,
					     nwsi->mux.child_list) {
				lwsl_info("%s: adi child tc cr %d +%d -> %d",
					  __func__, (int)w->txc.tx_cr,
					  b - (unsigned int)settings->s[a],
					  (int)w->txc.tx_cr + b -
						  (unsigned int)settings->s[a]);
				w->txc.tx_cr += b - settings->s[a];
				if (w->txc.tx_cr > 0 &&
				    w->txc.tx_cr <=
						  (int32_t)(b - settings->s[a]))

					lws_callback_on_writable(w);
			} lws_end_foreach_ll(w, mux.sibling_list);

			break;
		case H2SET_MAX_FRAME_SIZE:
			if (b < wsi->vhost->h2.set.s[H2SET_MAX_FRAME_SIZE]) {
				lws_h2_goaway(nwsi, H2_ERR_PROTOCOL_ERROR,
					      "Frame size < initial");
				return 1;
			}
			if (b > 0x00ffffff) {
				lws_h2_goaway(nwsi, H2_ERR_PROTOCOL_ERROR,
					      "Settings Frame size above max");
				return 1;
			}
			break;
		case H2SET_MAX_HEADER_LIST_SIZE:
			break;
		}
		settings->s[a] = b;
		lwsl_info("http2 settings %d <- 0x%x\n", a, b);
skip:
		len -= LWS_H2_SETTINGS_LEN;
		buf += LWS_H2_SETTINGS_LEN;
	}

	if (len)
		return 1;

	lws_h2_dump_settings(settings);

	return 0;
}